

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

bool matchWhileUnsplitting
               (char *buffer,int buffer_len,int start,char *needle,int needle_len,int *matchlen,
               int *lines)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  iVar1 = start;
  if (0 < needle_len) {
    uVar2 = (ulong)(uint)needle_len;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if ((buffer_len <= iVar1) || (buffer[iVar1] != needle[uVar3])) goto LAB_0016af6d;
    iVar1 = skipEscapedLineEnds(buffer,buffer_len,iVar1 + 1,lines);
  }
  *matchlen = iVar1 - start;
LAB_0016af6d:
  return (long)needle_len <= (long)uVar3;
}

Assistant:

static bool matchWhileUnsplitting(const char *buffer, int buffer_len, int start,
                                  const char *needle, int needle_len,
                                  int *matchlen, int *lines)
{
    int x = start;
    for (int n = 0; n < needle_len;
         n++, x = skipEscapedLineEnds(buffer, buffer_len, x + 1, lines)) {
        if (x >= buffer_len || buffer[x] != needle[n])
            return false;
    }
    // That also skipped any remaining BSNLs immediately after the match.

    // Tell caller how long the match was:
    *matchlen = x - start;

    return true;
}